

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

bool CheckConfigFileVariable
               (TCascStorage *hs,char *szLinePtr,char *szLineEnd,char *szVarName,
               PARSE_VARIABLE PfnParseProc,void *pvParseParam)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  byte *pbVar6;
  char *pcVar7;
  byte *pbVar8;
  char szVariableName [80];
  byte local_78 [80];
  
  pbVar6 = local_78;
  pbVar8 = (byte *)szLinePtr;
  if (szLinePtr < szLineEnd) {
    do {
      szLinePtr = (char *)pbVar8;
      if (0x20 < (byte)*szLinePtr) break;
      pbVar8 = (byte *)szLinePtr + 1;
      szLinePtr = szLineEnd;
    } while (pbVar8 != (byte *)szLineEnd);
  }
  if (szLinePtr < szLineEnd) {
    uVar2 = 0;
    do {
      uVar5 = uVar2;
      bVar1 = *szLinePtr;
      if ((bVar1 < 0x21) || (bVar1 == 0x3d)) {
        pbVar6 = local_78 + uVar5;
        goto LAB_0011235f;
      }
      szLinePtr = (char *)((byte *)szLinePtr + 1);
      local_78[uVar5] = bVar1;
    } while ((szLinePtr < szLineEnd) && (uVar2 = uVar5 + 1, uVar5 < 0x4e));
    pbVar6 = local_78 + uVar5 + 1;
  }
LAB_0011235f:
  *pbVar6 = 0;
  if ((((byte *)szLinePtr != (byte *)0x0) &&
      (bVar3 = CheckWildCard((char *)local_78,szVarName), bVar3)) &&
     (bVar3 = szLinePtr < szLineEnd, bVar3)) {
    if ((byte)*szLinePtr < 0x21 || *szLinePtr == 0x3d) {
      pcVar7 = szLineEnd + ~(ulong)szLinePtr;
      do {
        if (pcVar7 == (char *)0x0) {
          return false;
        }
        szLinePtr = (char *)((byte *)szLinePtr + 1);
        pcVar7 = pcVar7 + -1;
      } while ((byte)*szLinePtr < 0x21 || *szLinePtr == 0x3d);
      bVar3 = szLinePtr < szLineEnd;
    }
    if (bVar3) {
      iVar4 = (*PfnParseProc)(hs,(char *)local_78,szLinePtr,szLineEnd,pvParseParam);
      return iVar4 == 0;
    }
  }
  return false;
}

Assistant:

static bool CheckConfigFileVariable(
    TCascStorage * hs,                  // Pointer to storage structure
    const char * szLinePtr,             // Pointer to the begin of the line
    const char * szLineEnd,             // Pointer to the end of the line
    const char * szVarName,             // Pointer to the variable to check
    PARSE_VARIABLE PfnParseProc,        // Pointer to the parsing function
    void * pvParseParam)                // Pointer to the parameter passed to parsing function
{
    char szVariableName[MAX_VAR_NAME];

    // Capture the variable from the line
    szLinePtr = CaptureSingleString(szLinePtr, szLineEnd, szVariableName, sizeof(szVariableName));
    if (szLinePtr == NULL)
        return false;

    // Verify whether this is the variable
    if (!CheckWildCard(szVariableName, szVarName))
        return false;

    // Skip the spaces and '='
    while (szLinePtr < szLineEnd && (IsWhiteSpace(szLinePtr) || szLinePtr[0] == '='))
        szLinePtr++;

    // Call the parsing function only if there is some data
    if (szLinePtr >= szLineEnd)
        return false;

    return (PfnParseProc(hs, szVariableName, szLinePtr, szLineEnd, pvParseParam) == ERROR_SUCCESS);
}